

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

sunrealtype LBasisD3(ARKInterp I,int j,sunrealtype t)

{
  double dVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  sunrealtype sVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  pvVar2 = I->content;
  uVar3 = (ulong)*(int *)((long)pvVar2 + 0x18);
  if ((long)uVar3 < 1) {
    sVar10 = 0.0;
  }
  else {
    lVar4 = (long)j;
    uVar5 = (ulong)(uint)j;
    sVar10 = 0.0;
    uVar6 = 0;
    do {
      if (uVar6 != uVar5) {
        dVar11 = 0.0;
        uVar7 = 0;
        do {
          if (uVar7 != uVar6 && uVar7 != uVar5) {
            dVar12 = 0.0;
            uVar8 = 0;
            do {
              if (((uVar8 != uVar7) && (uVar8 != uVar5)) && (uVar8 != uVar6)) {
                uVar9 = 0;
                dVar13 = 1.0;
                do {
                  if (((uVar8 != uVar9) && (uVar7 != uVar9)) &&
                     ((uVar5 != uVar9 && (uVar6 != uVar9)))) {
                    dVar1 = *(double *)(*(long *)((long)pvVar2 + 0x10) + uVar9 * 8);
                    dVar13 = dVar13 * ((t - dVar1) /
                                      (*(double *)(*(long *)((long)pvVar2 + 0x10) + lVar4 * 8) -
                                      dVar1));
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar3 != uVar9);
                dVar12 = dVar12 + dVar13 / (*(double *)(*(long *)((long)pvVar2 + 0x10) + lVar4 * 8)
                                           - *(double *)(*(long *)((long)pvVar2 + 0x10) + uVar8 * 8)
                                           );
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 != uVar3);
            dVar11 = dVar11 + dVar12 / (*(double *)(*(long *)((long)pvVar2 + 0x10) + lVar4 * 8) -
                                       *(double *)(*(long *)((long)pvVar2 + 0x10) + uVar7 * 8));
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar3);
        sVar10 = sVar10 + dVar11 / (*(double *)(*(long *)((long)pvVar2 + 0x10) + lVar4 * 8) -
                                   *(double *)(*(long *)((long)pvVar2 + 0x10) + uVar6 * 8));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar3);
  }
  return sVar10;
}

Assistant:

sunrealtype LBasisD3(ARKInterp I, int j, sunrealtype t)
{
  int i, k, l, m;
  sunrealtype p, q, r, s;
  p = ZERO;
  for (m = 0; m < LINT_NHIST(I); m++)
  {
    if (m == j) { continue; }
    q = ZERO;
    for (l = 0; l < LINT_NHIST(I); l++)
    {
      if (l == j) { continue; }
      if (l == m) { continue; }
      r = ZERO;
      for (i = 0; i < LINT_NHIST(I); i++)
      {
        if (i == j) { continue; }
        if (i == m) { continue; }
        if (i == l) { continue; }
        s = ONE;
        for (k = 0; k < LINT_NHIST(I); k++)
        {
          if (k == j) { continue; }
          if (k == m) { continue; }
          if (k == l) { continue; }
          if (k == i) { continue; }
          s *= (t - LINT_TJ(I, k)) / (LINT_TJ(I, j) - LINT_TJ(I, k));
        }
        r += s / (LINT_TJ(I, j) - LINT_TJ(I, i));
      }
      q += r / (LINT_TJ(I, j) - LINT_TJ(I, l));
    }
    p += q / (LINT_TJ(I, j) - LINT_TJ(I, m));
  }

  return (p);
}